

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O0

void __thiscall FinalParser::ProcessDecl(FinalParser *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Sym local_128;
  string local_d8;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  Sym newsym;
  int i;
  FinalParser *this_local;
  
  newsym.dValue._4_4_ = 0;
  do {
    uVar2 = (ulong)newsym.dValue._4_4_;
    sVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::size(&this->token);
    if (sVar3 <= uVar2) {
      return;
    }
    pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->token,(long)newsym.dValue._4_4_);
    bVar1 = std::operator==(&pvVar4->attributevalue,"{");
    if (bVar1) {
      this->index = newsym.dValue._4_4_;
      return;
    }
    pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->token,(long)newsym.dValue._4_4_);
    bVar1 = std::operator==(&pvVar4->attributevalue,"real");
    if (bVar1) {
LAB_00153509:
      pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->token,(long)newsym.dValue._4_4_);
      std::__cxx11::string::string((string *)&local_88,(string *)&pvVar4->attributevalue);
      pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->token,(long)(newsym.dValue._4_4_ + 1));
      std::__cxx11::string::string((string *)&local_a8,(string *)&pvVar4->attributevalue);
      pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->token,(long)(newsym.dValue._4_4_ + 3));
      std::__cxx11::string::string((string *)&local_d8,(string *)&pvVar4->attributevalue);
      Sym::Sym((Sym *)local_68,&local_88,&local_a8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      Sym::Sym(&local_128,(Sym *)local_68);
      SymTable::AddSym(&this->table,&local_128);
      Sym::~Sym(&local_128);
      Sym::~Sym((Sym *)local_68);
    }
    else {
      pvVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->token,(long)newsym.dValue._4_4_);
      bVar1 = std::operator==(&pvVar4->attributevalue,"int");
      if (bVar1) goto LAB_00153509;
    }
    newsym.dValue._4_4_ = newsym.dValue._4_4_ + 1;
  } while( true );
}

Assistant:

void FinalParser::ProcessDecl() {

    for (int i = 0; i < token.size(); i++) {
        if (token[i].attributevalue == "{") {
            index = i;
            return;
        } else if (token[i].attributevalue == "real" || token[i].attributevalue == "int") {
            Sym newsym(token[i].attributevalue, token[i + 1].attributevalue, token[i + 3].attributevalue);
            table.AddSym(newsym);
        }
    }
}